

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

ExecutionMode __thiscall
Js::FunctionExecutionStateMachine::GetInterpreterExecutionMode
          (FunctionExecutionStateMachine *this,bool isPostBailout)

{
  code *pcVar1;
  bool bVar2;
  ExecutionMode EVar3;
  ExecutionState state;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  ExecutionMode local_2a;
  ExecutionMode executionMode;
  bool isPostBailout_local;
  FunctionExecutionStateMachine *this_local;
  
  if ((this->initializedExecutionModeAndLimits & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x10c,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (isPostBailout) {
    pFVar5 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
    bVar2 = FunctionBody::DoInterpreterProfile(pFVar5);
    if (bVar2) {
      return ProfilingInterpreter;
    }
  }
  EVar3 = GetExecutionMode(this);
  if (EVar3 < SimpleJit) {
    this_local._7_1_ = GetExecutionMode(this);
  }
  else {
    if (EVar3 == SimpleJit) {
      if ((DAT_01eafdac & 1) != 0) {
        state = GetDefaultInterpreterExecutionState(this);
        EVar3 = StateToMode(this,state);
        return EVar3;
      }
    }
    else if (EVar3 != FullJit) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                  ,0x12a,"(false)","false");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pFVar5 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
    bVar2 = FunctionBody::DoInterpreterProfile(pFVar5);
    local_2a = ProfilingInterpreter;
    if (!bVar2) {
      local_2a = Interpreter;
    }
    VerifyExecutionMode(this,local_2a);
    this_local._7_1_ = local_2a;
  }
  return this_local._7_1_;
}

Assistant:

ExecutionMode FunctionExecutionStateMachine::GetInterpreterExecutionMode(const bool isPostBailout)
    {
        Assert(initializedExecutionModeAndLimits);

        if (isPostBailout && owner->DoInterpreterProfile())
        {
            return ExecutionMode::ProfilingInterpreter;
        }

        switch (GetExecutionMode())
        {
        case ExecutionMode::Interpreter:
        case ExecutionMode::AutoProfilingInterpreter:
        case ExecutionMode::ProfilingInterpreter:
            return GetExecutionMode();

        case ExecutionMode::SimpleJit:
            if (CONFIG_FLAG(NewSimpleJit))
            {
                return StateToMode(GetDefaultInterpreterExecutionState());
            }
            // fall through

        case ExecutionMode::FullJit:
        {
            const ExecutionMode executionMode =
                owner->DoInterpreterProfile() ? ExecutionMode::ProfilingInterpreter : ExecutionMode::Interpreter;
            VerifyExecutionMode(executionMode);
            return executionMode;
        }

        default:
            Assert(false);
            __assume(false);
        }
    }